

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_tchalt_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  ArchCPU_conflict7 *cpu_00;
  MIPSCPU_conflict2 *cpu;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  cpu_00 = env_archcpu(env);
  (env->active_tc).CP0_TCHalt = arg1 & 1;
  if (((env->active_tc).CP0_TCHalt & 1) == 0) {
    mips_tc_wake(cpu_00,env->current_tc);
  }
  else {
    mips_tc_sleep(cpu_00,env->current_tc);
  }
  return;
}

Assistant:

void helper_mtc0_tchalt(CPUMIPSState *env, target_ulong arg1)
{
    MIPSCPU *cpu = env_archcpu(env);

    env->active_tc.CP0_TCHalt = arg1 & 0x1;

    /* TODO: Halt TC / Restart (if allocated+active) TC. */
    if (env->active_tc.CP0_TCHalt & 1) {
        mips_tc_sleep(cpu, env->current_tc);
    } else {
        mips_tc_wake(cpu, env->current_tc);
    }
}